

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimize_constraint.cpp
# Opt level: O1

bool __thiscall
Clasp::UncoreMinimize::handleUnsat(UncoreMinimize *this,Solver *s,bool up,LitVec *param_3)

{
  LowerType *pLVar1;
  undefined1 *puVar2;
  OptParams OVar3;
  pointer pLVar4;
  SharedData *pSVar5;
  long lVar6;
  bool bVar7;
  uint32 uVar8;
  uint32 uVar9;
  long lVar10;
  uint uVar11;
  uint32 *puVar12;
  ulong uVar13;
  LitPair local_38;
  
  if (this->enum_ != (DefaultMinimize *)0x0) {
    DefaultMinimize::relaxBound(this->enum_,true);
  }
  OVar3 = this->options_;
  do {
    if ((this->field_0xef & 0x10) == 0) {
      if (((s->conflict_).ebo_.size != 0) && ((((s->conflict_).ebo_.buf)->rep_ ^ 2) < 2)) {
        return false;
      }
      if ((this->todo_).next_ != 0) {
        this->lower_ = this->lower_ - (long)(this->todo_).minW_;
        (this->todo_).lits_.ebo_.size = 0;
        (this->todo_).minW_ = 0x7fffffff;
      }
      uVar8 = analyze(this,s);
      if (uVar8 == 0) {
        (this->todo_).lits_.ebo_.size = 0;
        (this->todo_).core_.ebo_.size = 0;
        (this->todo_).minW_ = 0x7fffffff;
        (this->todo_).last_ = 0;
        (this->todo_).next_ = 0;
        (this->todo_).step_ = 0;
      }
      else {
        this->lower_ = this->lower_ + (long)(this->todo_).minW_;
        if ((this->field_0xef & 0x20) == 0) {
          if (((((uint)OVar3 & 0xe0) == 0) || (bVar7 = validLowerBound(this), !bVar7)) ||
             (bVar7 = Todo::shrinkNext(&this->todo_,this,'\x02'), !bVar7)) {
            resetTrim(this,s);
          }
          else {
            popPath(this,s,0);
          }
        }
        else {
          local_38.lit.rep_ = 0;
          local_38.id = 0;
          bk_lib::
          pod_vector<Clasp::UncoreMinimize::LitPair,_std::allocator<Clasp::UncoreMinimize::LitPair>_>
          ::push_back(&(this->todo_).lits_,&local_38);
          (this->todo_).minW_ = 0x7fffffff;
          pLVar4 = (this->todo_).lits_.ebo_.buf;
          uVar13 = (ulong)(this->todo_).lits_.ebo_.size;
          uVar9 = pLVar4[uVar13 - (uVar8 + 1)].id;
          if (uVar9 != 0) {
            puVar12 = &pLVar4[(uVar13 + 1) - (ulong)(uVar8 + 1)].id;
            do {
              puVar2 = &(this->litData_).ebo_.buf[uVar9 - 1].field_0x4;
              *(uint *)puVar2 = *(uint *)puVar2 & 0xbfffffff;
              uVar9 = *puVar12;
              puVar12 = puVar12 + 2;
            } while (uVar9 != 0);
          }
        }
        bVar7 = validLowerBound(this);
        uVar11 = *(uint *)&this->field_0xec;
        *(uint *)&this->field_0xec = uVar11 & 0xefffffff | (uint)!bVar7 << 0x1c;
        if (up) {
          pSVar5 = (this->super_MinimizeConstraint).shared_;
          lVar6 = this->lower_;
          uVar11 = uVar11 & 0xfffffff;
          do {
            lVar10 = pSVar5->lower_[uVar11].super___atomic_base<long>._M_i;
            if (lVar6 <= lVar10) break;
            pLVar1 = pSVar5->lower_ + uVar11;
            LOCK();
            bVar7 = lVar10 == (pLVar1->super___atomic_base<long>)._M_i;
            if (bVar7) {
              (pLVar1->super___atomic_base<long>)._M_i = lVar6;
            }
            UNLOCK();
            lVar10 = lVar6;
          } while (!bVar7);
          lVar6 = this->lower_;
          if (lVar10 == lVar6) {
            uVar11 = *(uint *)&this->field_0xec & 0xfffffff;
            (s->lower).level = uVar11;
            (s->lower).bound =
                 lVar6 + (((this->super_MinimizeConstraint).shared_)->adjust_).ebo_.buf[uVar11];
          }
        }
      }
      if (uVar8 == 0) {
        return false;
      }
    }
    else {
      Solver::clearStopConflict(s);
      addNext(this,s,true);
    }
    if ((*(uint *)&this->field_0xec & 0x10000000) == 0 && (s->conflict_).ebo_.size == 0) {
      return true;
    }
  } while( true );
}

Assistant:

bool UncoreMinimize::handleUnsat(Solver& s, bool up, LitVec&) {
	assert(s.hasConflict());
	if (enum_) { enum_->relaxBound(true); }
	bool trimCore = options_.trim != 0u;
	do {
		if (next_ == 0) {
			if (s.hasStopConflict()) { return false; }
			if (todo_.shrink()) {
				lower_ -= todo_.weight();
				todo_.clear(false);
			}
			uint32 cs = analyze(s);
			if (!cs) {
				todo_.clear();
				return false;
			}
			lower_ += todo_.weight();
			if (disj_) { // preprocessing: remove assumptions and remember core
				todo_.terminate(); // null-terminate core
				for (Todo::const_iterator it = todo_.end() - (cs + 1); it->id; ++it) {
					getData(it->id).assume = 0;
				}
			}
			else if (trimCore && validLowerBound() && todo_.shrinkNext(*this, value_false)) {
				popPath(s, 0);
			}
			else {
				resetTrim(s);
			}
			next_ = !validLowerBound();
			if (up && shared_->incLower(level_, lower_) == lower_) {
				reportLower(s, level_, lower_);
			}
		}
		else {
			s.clearStopConflict();
			addNext(s);
		}
	} while (next_ || s.hasConflict());
	return true;
}